

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

uint128_wrapper *
fmt::v7::detail::dragonbox::cache_accessor<double>::get_cached_power
          (uint128_wrapper *__return_storage_ptr__,int k)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint128_wrapper *puVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  iVar7 = (int)__return_storage_ptr__;
  uVar10 = iVar7 + 0x124;
  if (0x26a < uVar10) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x75e,"k is out of range");
  }
  uVar6 = (uVar10 & 0xffff) * 0x2f69 >> 0x10;
  uVar6 = ((uVar10 - uVar6 & 0xffff) >> 1) + uVar6;
  uVar8 = (ulong)(uVar6 & 0xfffffff0);
  puVar5 = *(uint128_wrapper **)(basic_data<void>::dragonbox_pow10_significands_128 + uVar8);
  iVar11 = ((uVar6 >> 4) * 0x1b & 0xffff) - 0x124;
  iVar9 = iVar7 - iVar11;
  if (iVar9 != 0) {
    iVar7 = (iVar7 * 0x1a934f >> 0x13) - ((iVar11 * 0x1a934f >> 0x13) + iVar9);
    if (0x3e < iVar7 - 1U) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                  ,0x772,"shifting error detected");
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar9 * 8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)puVar5 - (ulong)(uVar10 < 0x129);
    bVar1 = (byte)iVar7 & 0x3f;
    uVar4 = SUB168(auVar2 * auVar3,0) >> bVar1 |
            SUB168(auVar2 * auVar3,8) +
            *(long *)(basic_data<void>::dragonbox_pow10_significands_128 + uVar8 + 8) *
            *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar9 * 8) << 0x40 - bVar1;
    uVar8 = uVar4 + 1;
    if (0x128 < uVar10) {
      uVar8 = uVar4;
    }
    uVar4 = (ulong)(*(uint *)(basic_data<void>::dragonbox_pow10_recovery_errors +
                             (ulong)(uVar10 >> 4) * 4) >> (uVar10 * 2 & 0x1f) & 3);
    puVar5 = (uint128_wrapper *)(uVar4 + uVar8);
    if (CARRY8(uVar4,uVar8)) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                  ,0x78c,"");
    }
  }
  return puVar5;
}

Assistant:

static uint128_wrapper get_cached_power(int k) FMT_NOEXCEPT {
    FMT_ASSERT(k >= float_info<double>::min_k && k <= float_info<double>::max_k,
               "k is out of range");

#if FMT_USE_FULL_CACHE_DRAGONBOX
    return data::dragonbox_pow10_significands_128[k -
                                                  float_info<double>::min_k];
#else
    static const int compression_ratio = 27;

    // Compute base index.
    int cache_index = (k - float_info<double>::min_k) / compression_ratio;
    int kb = cache_index * compression_ratio + float_info<double>::min_k;
    int offset = k - kb;

    // Get base cache.
    uint128_wrapper base_cache =
        data::dragonbox_pow10_significands_128[cache_index];
    if (offset == 0) return base_cache;

    // Compute the required amount of bit-shift.
    int alpha = floor_log2_pow10(kb + offset) - floor_log2_pow10(kb) - offset;
    FMT_ASSERT(alpha > 0 && alpha < 64, "shifting error detected");

    // Try to recover the real cache.
    uint64_t pow5 = data::powers_of_5_64[offset];
    uint128_wrapper recovered_cache = umul128(base_cache.high(), pow5);
    uint128_wrapper middle_low =
        umul128(base_cache.low() - (kb < 0 ? 1u : 0u), pow5);

    recovered_cache += middle_low.high();

    uint64_t high_to_middle = recovered_cache.high() << (64 - alpha);
    uint64_t middle_to_low = recovered_cache.low() << (64 - alpha);

    recovered_cache =
        uint128_wrapper{(recovered_cache.low() >> alpha) | high_to_middle,
                        ((middle_low.low() >> alpha) | middle_to_low)};

    if (kb < 0) recovered_cache += 1;

    // Get error.
    int error_idx = (k - float_info<double>::min_k) / 16;
    uint32_t error = (data::dragonbox_pow10_recovery_errors[error_idx] >>
                      ((k - float_info<double>::min_k) % 16) * 2) &
                     0x3;

    // Add the error back.
    FMT_ASSERT(recovered_cache.low() + error >= recovered_cache.low(), "");
    return {recovered_cache.high(), recovered_cache.low() + error};
#endif
  }